

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O2

void __thiscall random_tests::shuffle_stat_test::test_method(shuffle_stat_test *this)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [12];
  byte bVar10;
  byte bVar11;
  short sVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  iterator in_R8;
  iterator pvVar16;
  iterator in_R9;
  iterator pvVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar20;
  double local_3328;
  char *local_3308;
  char *local_3300;
  undefined1 *local_32f8;
  undefined1 *local_32f0;
  char *local_32e8;
  char *local_32e0;
  char *local_32d8;
  char *local_32d0;
  undefined1 *local_32c8;
  undefined1 *local_32c0;
  char *local_32b8;
  char *local_32b0;
  char *local_32a8;
  char *local_32a0;
  undefined1 *local_3298;
  undefined1 *local_3290;
  char *local_3288;
  char *local_3280;
  char *local_3278;
  char *local_3270;
  undefined1 *local_3268;
  undefined1 *local_3260;
  char *local_3258;
  char *local_3250;
  char *local_3248;
  char *local_3240;
  undefined1 *local_3238;
  undefined1 *local_3230;
  char *local_3228;
  char *local_3220;
  char *local_3218;
  char *local_3210;
  char *local_3208;
  char *local_3200;
  assertion_result local_31f8;
  undefined1 *local_31e0;
  undefined1 *local_31d8;
  char *local_31d0;
  char *local_31c8;
  uint sum;
  int data [5];
  int iStack_31a4;
  char **local_31a0;
  uint32_t counts [3125];
  FastRandomContext ctx;
  
  counts[0x85a] = 0;
  counts[0x85b] = 0;
  counts[0x45a] = 0;
  counts[0x45b] = 0;
  counts[0x5a] = 0;
  counts[0x5b] = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&ctx,true);
  memset(counts,0,0x30d4);
  iVar15 = 12000;
  while (bVar19 = iVar15 != 0, iVar15 = iVar15 + -1, bVar19) {
    data[0] = 0;
    data[1] = 1;
    data[2]._0_1_ = 2;
    data._9_7_ = 0x3000000;
    data[4] = 4;
    std::shuffle<int*,FastRandomContext&>(data,&iStack_31a4,&ctx);
    auVar9[4] = (undefined1)data[2];
    auVar9._0_4_ = data[1];
    auVar9._5_7_ = data._9_7_;
    auVar8._12_4_ = data[4];
    auVar8._0_12_ = auVar9;
    counts[data[4] * 0x271 + auVar9._4_4_ * 0x19 +
           (int)((auVar8._8_8_ & 0xffffffff) * 0x7d) + data[1] * 5 + data[0]] =
         counts[data[4] * 0x271 + auVar9._4_4_ * 0x19 +
                (int)((auVar8._8_8_ & 0xffffffff) * 0x7d) + data[1] * 5 + data[0]] + 1;
  }
  sum = 0;
  local_3328 = 0.0;
  uVar14 = 0;
  uVar18 = 0;
  while( true ) {
    uVar4 = (uVar18 & 0xffffffff) % 5;
    if (uVar18 == 0xc35) break;
    uVar5 = (ushort)uVar18;
    uVar3 = (uVar5 / 5) % 5;
    bVar10 = (byte)((uVar5 / 0x19 & 0xff) % 5);
    uVar7 = (uint)bVar10;
    bVar11 = (byte)((uVar5 / 0x7d & 0xff) % 5);
    uVar6 = (uint)bVar11;
    msg.m_end = (iterator)CONCAT62((int6)((ulong)in_R9 >> 0x10),0x271);
    uVar13 = uVar5 / 0x271;
    uVar1 = counts[uVar18];
    if ((((((uVar6 == uVar13) || (uVar7 == uVar13)) || (bVar10 == bVar11)) ||
         (((short)uVar3 == (short)uVar13 || (uVar3 == uVar6)))) ||
        ((uVar3 == uVar7 ||
         ((sVar12 = (short)uVar4, sVar12 == (short)uVar13 || (uVar13 = (uint)uVar4, uVar13 == uVar6)
          ))))) || ((sVar12 == (short)uVar3 || (uVar13 == uVar7)))) {
      local_31d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_31c8 = "";
      local_31e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_31d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0xe5;
      file_01.m_begin = (iterator)&local_31d0;
      msg_01.m_end = msg.m_end;
      msg_01.m_begin = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_31e0,
                 msg_01);
      local_31f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(uVar1 == 0);
      local_31f8.m_message.px = (element_type *)0x0;
      local_31f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_3208 = "count == 0";
      local_3200 = "";
      data[2]._0_1_ = 0;
      data[0] = 0x11481f0;
      data[1] = 0;
      data[4] = 0x115c140;
      iStack_31a4 = 0;
      local_31a0 = &local_3208;
      local_3218 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3210 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_31f8,(lazy_ostream *)data,1,0,WARN,_cVar20,(size_t)&local_3218,0xe5);
      boost::detail::shared_count::~shared_count(&local_31f8.m_message.pn);
    }
    else {
      local_3228 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3220 = "";
      local_3238 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3230 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0xe8;
      file.m_begin = (iterator)&local_3228;
      msg.m_begin = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3238,msg
                );
      local_31f8.m_message = (shared_ptr<boost::basic_wrap_stringstream<char>_>)ZEXT816(0);
      local_3208 = "count > 50";
      local_3200 = "";
      data[2]._0_1_ = 0;
      data[0] = 0x11481f0;
      data[1] = 0;
      data[4] = 0x115c140;
      iStack_31a4 = 0;
      local_31a0 = &local_3208;
      local_3248 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3240 = "";
      pvVar16 = &DAT_00000001;
      pvVar17 = (iterator)0x0;
      local_31f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(0x32 < uVar1);
      boost::test_tools::tt_detail::report_assertion
                (&local_31f8,(lazy_ostream *)data,1,0,WARN,_cVar20,(size_t)&local_3248,0xe8);
      boost::detail::shared_count::~shared_count(&local_31f8.m_message.pn);
      local_3258 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3250 = "";
      local_3268 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3260 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xe9;
      file_00.m_begin = (iterator)&local_3258;
      msg_00.m_end = pvVar17;
      msg_00.m_begin = pvVar16;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3268,
                 msg_00);
      local_31f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(uVar1 < 0x96);
      local_31f8.m_message = (shared_ptr<boost::basic_wrap_stringstream<char>_>)ZEXT816(0);
      local_3208 = "count < 150";
      local_3200 = "";
      data[2]._0_1_ = 0;
      data[0] = 0x11481f0;
      data[1] = 0;
      data[4] = 0x115c140;
      iStack_31a4 = 0;
      local_31a0 = &local_3208;
      local_3278 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_3270 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_31f8,(lazy_ostream *)data,1,0,WARN,_cVar20,(size_t)&local_3278,0xe9);
      local_3328 = local_3328 + (((double)uVar1 + -100.0) * ((double)uVar1 + -100.0)) / 100.0;
      boost::detail::shared_count::~shared_count(&local_31f8.m_message.pn);
      uVar14 = uVar14 + uVar1;
      sum = uVar14;
    }
    uVar18 = uVar18 + 1;
  }
  local_3288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3280 = "";
  local_3298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xed;
  file_02.m_begin = (iterator)&local_3288;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3298,
             msg_02);
  local_31f8.m_message = (shared_ptr<boost::basic_wrap_stringstream<char>_>)ZEXT816(0);
  local_3208 = "chi_score > 58.1411";
  local_3200 = "";
  data[2]._0_1_ = 0;
  data[0] = 0x11481f0;
  data[1] = 0;
  data[4] = 0x115c140;
  iStack_31a4 = 0;
  local_31a0 = &local_3208;
  local_32a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_32a0 = "";
  pvVar16 = &DAT_00000001;
  pvVar17 = (iterator)0x0;
  local_31f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(58.1411 < local_3328);
  boost::test_tools::tt_detail::report_assertion
            (&local_31f8,(lazy_ostream *)data,1,0,WARN,_cVar20,(size_t)&local_32a8,0xed);
  boost::detail::shared_count::~shared_count(&local_31f8.m_message.pn);
  local_32b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_32b0 = "";
  local_32c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_32c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xee;
  file_03.m_begin = (iterator)&local_32b8;
  msg_03.m_end = pvVar17;
  msg_03.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_32c8,
             msg_03);
  local_31f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_3328 < 210.275);
  local_31f8.m_message = (shared_ptr<boost::basic_wrap_stringstream<char>_>)ZEXT816(0);
  local_3208 = "chi_score < 210.275";
  local_3200 = "";
  data[2]._0_1_ = 0;
  data[0] = 0x11481f0;
  data[1] = 0;
  data[4] = 0x115c140;
  iStack_31a4 = 0;
  local_31a0 = &local_3208;
  local_32d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_32d0 = "";
  pvVar16 = &DAT_00000001;
  pvVar17 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_31f8,(lazy_ostream *)data,1,0,WARN,_cVar20,(size_t)&local_32d8,0xee);
  boost::detail::shared_count::~shared_count(&local_31f8.m_message.pn);
  local_32e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_32e0 = "";
  local_32f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_32f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xef;
  file_04.m_begin = (iterator)&local_32e8;
  msg_04.m_end = pvVar17;
  msg_04.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_32f8,
             msg_04);
  data[2]._0_1_ = 0;
  data[0] = 0x11480b0;
  data[1] = 0;
  data[4] = 0x115c140;
  iStack_31a4 = 0;
  local_31a0 = (char **)0xc7f1cc;
  local_3308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3300 = "";
  local_31f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0xe0;
  local_31f8._1_3_ = 0x2e;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (data,&local_3308,0xef,1,2,&sum,"sum",&local_31f8,"12000U");
  ChaCha20::~ChaCha20(&ctx.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(shuffle_stat_test)
{
    FastRandomContext ctx(true);
    uint32_t counts[5 * 5 * 5 * 5 * 5] = {0};
    for (int i = 0; i < 12000; ++i) {
        int data[5] = {0, 1, 2, 3, 4};
        std::shuffle(std::begin(data), std::end(data), ctx);
        int pos = data[0] + data[1] * 5 + data[2] * 25 + data[3] * 125 + data[4] * 625;
        ++counts[pos];
    }
    unsigned int sum = 0;
    double chi_score = 0.0;
    for (int i = 0; i < 5 * 5 * 5 * 5 * 5; ++i) {
        int i1 = i % 5, i2 = (i / 5) % 5, i3 = (i / 25) % 5, i4 = (i / 125) % 5, i5 = i / 625;
        uint32_t count = counts[i];
        if (i1 == i2 || i1 == i3 || i1 == i4 || i1 == i5 || i2 == i3 || i2 == i4 || i2 == i5 || i3 == i4 || i3 == i5 || i4 == i5) {
            BOOST_CHECK(count == 0);
        } else {
            chi_score += ((count - 100.0) * (count - 100.0)) / 100.0;
            BOOST_CHECK(count > 50);
            BOOST_CHECK(count < 150);
            sum += count;
        }
    }
    BOOST_CHECK(chi_score > 58.1411); // 99.9999% confidence interval
    BOOST_CHECK(chi_score < 210.275);
    BOOST_CHECK_EQUAL(sum, 12000U);
}